

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::read_sof_marker(jpeg_decoder *this)

{
  uint uVar1;
  uint uVar2;
  jpeg_decoder *in_RDI;
  uint num_left;
  int i;
  jpgd_status status;
  int in_stack_fffffffffffffff4;
  int num_bits;
  jpeg_decoder *this_00;
  
  this_00 = in_RDI;
  uVar1 = get_bits(in_RDI,in_stack_fffffffffffffff4);
  uVar2 = get_bits(this_00,in_stack_fffffffffffffff4);
  status = (jpgd_status)((ulong)in_RDI >> 0x20);
  if (uVar2 != 8) {
    stop_decoding((jpeg_decoder *)CONCAT44(in_stack_fffffffffffffff4,uVar1),status);
  }
  uVar2 = get_bits(this_00,in_stack_fffffffffffffff4);
  in_RDI->m_image_y_size = uVar2;
  if ((in_RDI->m_image_y_size < 1) || (0x8000 < in_RDI->m_image_y_size)) {
    stop_decoding((jpeg_decoder *)CONCAT44(in_stack_fffffffffffffff4,uVar1),status);
  }
  uVar2 = get_bits(this_00,in_stack_fffffffffffffff4);
  in_RDI->m_image_x_size = uVar2;
  if ((in_RDI->m_image_x_size < 1) || (0x8000 < in_RDI->m_image_x_size)) {
    stop_decoding((jpeg_decoder *)CONCAT44(in_stack_fffffffffffffff4,uVar1),status);
  }
  uVar2 = get_bits(this_00,in_stack_fffffffffffffff4);
  in_RDI->m_comps_in_frame = uVar2;
  if (4 < in_RDI->m_comps_in_frame) {
    stop_decoding((jpeg_decoder *)CONCAT44(in_stack_fffffffffffffff4,uVar1),status);
  }
  if (uVar1 != in_RDI->m_comps_in_frame * 3 + 8U) {
    stop_decoding((jpeg_decoder *)CONCAT44(in_stack_fffffffffffffff4,uVar1),status);
  }
  num_bits = 0;
  while( true ) {
    if (in_RDI->m_comps_in_frame <= num_bits) {
      return;
    }
    uVar2 = get_bits(this_00,num_bits);
    in_RDI->m_comp_ident[num_bits] = uVar2;
    uVar2 = get_bits(this_00,num_bits);
    in_RDI->m_comp_h_samp[num_bits] = uVar2;
    uVar2 = get_bits(this_00,num_bits);
    in_RDI->m_comp_v_samp[num_bits] = uVar2;
    if ((((in_RDI->m_comp_h_samp[num_bits] == 0) || (in_RDI->m_comp_v_samp[num_bits] == 0)) ||
        (2 < in_RDI->m_comp_h_samp[num_bits])) || (2 < in_RDI->m_comp_v_samp[num_bits])) break;
    uVar2 = get_bits(this_00,num_bits);
    in_RDI->m_comp_quant[num_bits] = uVar2;
    if (3 < in_RDI->m_comp_quant[num_bits]) {
      stop_decoding((jpeg_decoder *)CONCAT44(num_bits,uVar1),status);
    }
    num_bits = num_bits + 1;
  }
  stop_decoding((jpeg_decoder *)CONCAT44(num_bits,uVar1),status);
}

Assistant:

void jpeg_decoder::read_sof_marker()
	{
		int i;
		uint num_left;

		num_left = get_bits(16);

		/* precision: sorry, only 8-bit precision is supported */
		if (get_bits(8) != 8)
			stop_decoding(JPGD_BAD_PRECISION);

		m_image_y_size = get_bits(16);

		if ((m_image_y_size < 1) || (m_image_y_size > JPGD_MAX_HEIGHT))
			stop_decoding(JPGD_BAD_HEIGHT);

		m_image_x_size = get_bits(16);

		if ((m_image_x_size < 1) || (m_image_x_size > JPGD_MAX_WIDTH))
			stop_decoding(JPGD_BAD_WIDTH);

		m_comps_in_frame = get_bits(8);

		if (m_comps_in_frame > JPGD_MAX_COMPONENTS)
			stop_decoding(JPGD_TOO_MANY_COMPONENTS);

		if (num_left != (uint)(m_comps_in_frame * 3 + 8))
			stop_decoding(JPGD_BAD_SOF_LENGTH);

		for (i = 0; i < m_comps_in_frame; i++)
		{
			m_comp_ident[i] = get_bits(8);
			m_comp_h_samp[i] = get_bits(4);
			m_comp_v_samp[i] = get_bits(4);

			if (!m_comp_h_samp[i] || !m_comp_v_samp[i] || (m_comp_h_samp[i] > 2) || (m_comp_v_samp[i] > 2))
				stop_decoding(JPGD_UNSUPPORTED_SAMP_FACTORS);

			m_comp_quant[i] = get_bits(8);
			if (m_comp_quant[i] >= JPGD_MAX_QUANT_TABLES)
				stop_decoding(JPGD_DECODE_ERROR);
		}
	}